

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O0

void __thiscall
fasttext::QuantMatrix::QuantMatrix(QuantMatrix *this,DenseMatrix *mat,int32_t dsub,bool qnorm)

{
  DenseMatrix *pDVar1;
  int64_t iVar2;
  int64_t iVar3;
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_> *this_00;
  pointer __p;
  byte in_CL;
  int in_EDX;
  DenseMatrix *in_RDI;
  pointer in_stack_ffffffffffffff68;
  unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
  *in_stack_ffffffffffffff70;
  Matrix *in_stack_ffffffffffffff78;
  AlignedVector<float> *__new_size;
  size_t *this_01;
  DenseMatrix *pDVar4;
  ProductQuantizer *this_02;
  QuantMatrix *this_03;
  
  this_03 = (QuantMatrix *)0x0;
  iVar2 = Matrix::size(in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70);
  iVar3 = Matrix::size(in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70);
  Matrix::Matrix(&in_RDI->super_Matrix,iVar2,iVar3);
  (in_RDI->super_Matrix)._vptr_Matrix = (_func_int **)&PTR__QuantMatrix_001eebe0;
  __new_size = &in_RDI->data_;
  std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
  unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>(in_stack_ffffffffffffff70);
  this_01 = &(in_RDI->data_).size_;
  std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
  unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>(in_stack_ffffffffffffff70);
  pDVar4 = in_RDI + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c1338);
  this_02 = (ProductQuantizer *)&in_RDI[1].data_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c134b);
  *(byte *)&in_RDI[2].super_Matrix.m_ = in_CL & 1;
  pDVar1 = in_RDI + 2;
  iVar2 = Matrix::size(in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70);
  iVar3 = Matrix::size(in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70);
  *(int *)((long)&(pDVar1->super_Matrix).m_ + 4) =
       (int)iVar2 * (int)((iVar3 + -1 + (long)in_EDX) / (long)in_EDX);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,(size_type)__new_size)
  ;
  this_00 = (unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             *)operator_new(0x50);
  ProductQuantizer::ProductQuantizer(this_02,(int32_t)((ulong)pDVar4 >> 0x20),(int32_t)pDVar4);
  std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
  unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>
            (this_00,in_stack_ffffffffffffff68);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  operator=(this_00,(unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                     *)in_stack_ffffffffffffff68);
  std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
  ~unique_ptr(this_00);
  if ((in_RDI[2].super_Matrix.m_ & 1) != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,
               (size_type)__new_size);
    __p = (pointer)operator_new(0x50);
    ProductQuantizer::ProductQuantizer(this_02,(int32_t)((ulong)pDVar4 >> 0x20),(int32_t)pDVar4);
    std::unique_ptr<fasttext::ProductQuantizer,std::default_delete<fasttext::ProductQuantizer>>::
    unique_ptr<std::default_delete<fasttext::ProductQuantizer>,void>(this_00,__p);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    operator=(this_00,(unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                       *)__p);
    std::unique_ptr<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>::
    ~unique_ptr(this_00);
  }
  quantize(this_03,in_RDI);
  return;
}

Assistant:

QuantMatrix::QuantMatrix(DenseMatrix&& mat, int32_t dsub, bool qnorm)
    : Matrix(mat.size(0), mat.size(1)),
      qnorm_(qnorm),
      codesize_(mat.size(0) * ((mat.size(1) + dsub - 1) / dsub)) {
  codes_.resize(codesize_);
  pq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(n_, dsub));
  if (qnorm_) {
    norm_codes_.resize(m_);
    npq_ = std::unique_ptr<ProductQuantizer>(new ProductQuantizer(1, 1));
  }
  quantize(std::forward<DenseMatrix>(mat));
}